

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
::clear(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
        *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->numActive != 0) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      plVar1 = *(long **)((long)this->items + lVar3 + -0x10);
      plVar2 = (long *)((long)&(this->items->_M_dataplus)._M_p + lVar3);
      if (plVar2 != plVar1) {
        operator_delete(plVar1,*plVar2 + 1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < this->numActive);
  }
  this->numActive = 0;
  if (4 < this->numAllocated) {
    if (this->items != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->space;
    this->numAllocated = 4;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }